

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

_Bool check_noproxy(char *name,char *no_proxy)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  void *pvVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((no_proxy != (char *)0x0) && (*no_proxy != '\0')) {
    iVar1 = Curl_strcasecompare("*",no_proxy);
    if (iVar1 != 0) {
      return true;
    }
    sVar2 = strlen(no_proxy);
    pcVar3 = strchr(name,0x3a);
    if (pcVar3 == (char *)0x0) {
      uVar4 = strlen(name);
    }
    else {
      uVar4 = (long)pcVar3 - (long)name;
    }
    if (sVar2 != 0) {
      uVar9 = 0;
      do {
        uVar8 = uVar9 + 1;
        if (uVar9 + 1 < sVar2) {
          uVar8 = sVar2;
        }
        do {
          pvVar5 = memchr(", ",(int)no_proxy[uVar9],3);
          uVar10 = uVar9;
          if (pvVar5 == (void *)0x0) break;
          uVar9 = uVar9 + 1;
          uVar10 = uVar8;
        } while (uVar8 != uVar9);
        if (uVar10 == sVar2) {
          return false;
        }
        uVar9 = uVar10;
        sVar6 = uVar10;
        if (uVar10 < sVar2) {
          do {
            pvVar5 = memchr(", ",(int)no_proxy[sVar6],3);
            uVar9 = sVar6;
            if (pvVar5 != (void *)0x0) break;
            sVar6 = sVar6 + 1;
            uVar9 = sVar2;
          } while (sVar2 != sVar6);
        }
        lVar7 = (no_proxy[uVar10] == '.') + uVar10;
        uVar8 = uVar9 - lVar7;
        if (uVar8 <= uVar4) {
          iVar1 = Curl_strncasecompare(no_proxy + lVar7,name + (uVar4 - uVar8),uVar8);
          if ((iVar1 != 0) && ((uVar8 == uVar4 || ((name + (uVar4 - uVar8))[-1] == '.')))) {
            return true;
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < sVar2);
    }
  }
  return false;
}

Assistant:

static bool check_noproxy(const char *name, const char *no_proxy)
{
  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  size_t tok_start;
  size_t tok_end;
  const char *separator = ", ";
  size_t no_proxy_len;
  size_t namelen;
  char *endptr;

  if(no_proxy && no_proxy[0]) {
    if(strcasecompare("*", no_proxy)) {
      return TRUE;
    }

    /* NO_PROXY was specified and it wasn't just an asterisk */

    no_proxy_len = strlen(no_proxy);
    endptr = strchr(name, ':');
    if(endptr)
      namelen = endptr - name;
    else
      namelen = strlen(name);

    for(tok_start = 0; tok_start < no_proxy_len; tok_start = tok_end + 1) {
      while(tok_start < no_proxy_len &&
            strchr(separator, no_proxy[tok_start]) != NULL) {
        /* Look for the beginning of the token. */
        ++tok_start;
      }

      if(tok_start == no_proxy_len)
        break; /* It was all trailing separator chars, no more tokens. */

      for(tok_end = tok_start; tok_end < no_proxy_len &&
            strchr(separator, no_proxy[tok_end]) == NULL; ++tok_end)
        /* Look for the end of the token. */
        ;

      /* To match previous behaviour, where it was necessary to specify
       * ".local.com" to prevent matching "notlocal.com", we will leave
       * the '.' off.
       */
      if(no_proxy[tok_start] == '.')
        ++tok_start;

      if((tok_end - tok_start) <= namelen) {
        /* Match the last part of the name to the domain we are checking. */
        const char *checkn = name + namelen - (tok_end - tok_start);
        if(strncasecompare(no_proxy + tok_start, checkn,
                           tok_end - tok_start)) {
          if((tok_end - tok_start) == namelen || *(checkn - 1) == '.') {
            /* We either have an exact match, or the previous character is a .
             * so it is within the same domain, so no proxy for this host.
             */
            return TRUE;
          }
        }
      } /* if((tok_end - tok_start) <= namelen) */
    } /* for(tok_start = 0; tok_start < no_proxy_len;
         tok_start = tok_end + 1) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}